

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

EColorRange V_FindFontColor(FName *name)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar2 = TranslationLookup.Count - 1;
  iVar4 = 0;
  while( true ) {
    if (iVar2 < iVar4) {
      return CR_UNTRANSLATED;
    }
    uVar3 = (uint)(iVar4 + iVar2) >> 1;
    iVar1 = TranslationLookup.Array[uVar3].Name.Index;
    if (iVar1 == name->Index) break;
    if (iVar1 < name->Index) {
      iVar4 = uVar3 + 1;
    }
    else {
      iVar2 = uVar3 - 1;
    }
  }
  return TranslationLookup.Array[uVar3].Number;
}

Assistant:

unsigned int Size () const
	{
		return Count;
	}